

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O1

bool __thiscall jbcoin::STPathSet::isEquivalent(STPathSet *this,STBase *t)

{
  STPath *pSVar1;
  bool bVar2;
  STPath *this_00;
  STPath *t_00;
  
  if (t->_vptr_STBase != (_func_int **)&PTR__STPathSet_002d71d8) {
    return false;
  }
  this_00 = (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>._M_impl
           .super__Vector_impl_data._M_finish;
  t_00 = (STPath *)t[1]._vptr_STBase;
  if ((long)pSVar1 - (long)this_00 == (long)t[1].fName - (long)t_00) {
    if (this_00 == pSVar1) {
      return this_00 == pSVar1;
    }
    bVar2 = STPath::operator==(this_00,t_00);
    if (bVar2) {
      do {
        t_00 = t_00 + 1;
        this_00 = this_00 + 1;
        if (this_00 == pSVar1) {
          return this_00 == pSVar1;
        }
        bVar2 = STPath::operator==(this_00,t_00);
      } while (bVar2);
      return false;
    }
  }
  return false;
}

Assistant:

bool
STPathSet::isEquivalent (const STBase& t) const
{
    const STPathSet* v = dynamic_cast<const STPathSet*> (&t);
    return v && (value == v->value);
}